

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O3

void chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChMaterialShellANCF> *my_material,
               vector<double,_std::allocator<double>_> *node_ave_area,
               vector<int,_std::allocator<int>_> *Boundary_nodes,ChVector<double> *pos_transform,
               ChMatrix33<double> *rot_transform,double scaleFactor,bool printNodes,
               bool printElements)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int *piVar13;
  element_type *peVar14;
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  iterator __position;
  ChMesh *pCVar18;
  element_type *peVar19;
  double *pdVar20;
  undefined8 uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  _Alloc_hider _Var27;
  char cVar28;
  uint uVar29;
  int iVar30;
  undefined4 extraout_var;
  istream *piVar31;
  undefined4 extraout_var_00;
  ChLog *pCVar32;
  ChStreamOutAscii *pCVar33;
  ChElementShellANCF_3423 *this;
  ostream *poVar34;
  ChException *pCVar35;
  long *plVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  char *pcVar38;
  size_type *psVar39;
  int iVar40;
  int i;
  long lVar41;
  long lVar42;
  ulong uVar43;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  _Alloc_hider _Var48;
  size_type sVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  string line;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> node;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  elementsVector;
  ChMatrixDynamic<double> nodesXYZ;
  vector<int,_std::allocator<int>_> num_Normals;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> Normals;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elementsdxdy;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  nodesVector;
  ChMatrixDynamic<int> NumBEdges;
  istringstream stoken;
  istringstream ss;
  ifstream fin;
  ChNodeFEAxyzD *local_848;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_840;
  undefined1 local_838 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  undefined1 local_7f1;
  ulong local_7f0;
  shared_ptr<chrono::fea::ChMesh> *local_7e8;
  ulong local_7e0;
  undefined1 local_7d8 [16];
  value_type local_7c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7b8;
  DenseStorage<double,__1,__1,__1,_1> local_798;
  double local_780;
  uint local_774;
  ChVector<double> local_770;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_758;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_748;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_738;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> local_728;
  vector<int,_std::allocator<int>_> local_718;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_6f8;
  vector<double,_std::allocator<double>_> *local_6e0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_6d8;
  shared_ptr<chrono::fea::ChElementBase> local_6b8;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  local_6a8;
  DenseStorage<int,__1,__1,__1,_1> local_688;
  double local_668;
  undefined8 uStack_660;
  long local_658;
  undefined8 uStack_650;
  long local_648;
  undefined8 uStack_640;
  long local_638;
  undefined8 uStack_630;
  long local_628;
  undefined8 uStack_620;
  long local_618;
  undefined8 uStack_610;
  long local_608;
  undefined8 uStack_600;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5f8;
  ChVector<double> *local_5e8;
  vector<int,_std::allocator<int>_> *local_5e0;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  pointer local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_550;
  undefined1 local_548 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538 [3];
  ios_base local_4c0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  local_7e8 = mesh;
  local_780 = scaleFactor;
  local_6e0 = node_ave_area;
  local_5e8 = pos_transform;
  local_5e0 = Boundary_nodes;
  uVar29 = (*(((mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  local_838._24_8_ = CONCAT44(extraout_var,uVar29);
  printf("Current number of nodes in mesh is %d \n",(ulong)uVar29);
  local_798.m_data = (double *)0x0;
  local_798.m_rows = 0;
  local_798.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_798,4,1,4);
  local_688.m_data = (int *)0x0;
  local_688.m_rows = 0;
  local_688.m_cols = 0;
  Eigen::DenseStorage<int,_-1,_-1,_-1,_1>::resize(&local_688,3,1,3);
  local_6f8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6f8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)local_538,filename,(allocator *)&local_818);
    std::operator+(local_3b8,"ERROR opening Mesh file: ",local_538);
    plVar36 = (long *)std::__cxx11::string::append((char *)local_3b8);
    psVar39 = (size_type *)(plVar36 + 2);
    local_578._M_dataplus._M_p = (pointer)*plVar36;
    if ((size_type *)local_578._M_dataplus._M_p == psVar39) {
      local_578.field_2._M_allocated_capacity = *psVar39;
      local_578.field_2._8_8_ = plVar36[3];
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    }
    else {
      local_578.field_2._M_allocated_capacity = *psVar39;
    }
    local_578._M_string_length = plVar36[1];
    *plVar36 = (long)psVar39;
    plVar36[1] = 0;
    *(undefined1 *)(plVar36 + 2) = 0;
    ChException::ChException(pCVar35,&local_578);
    __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
  }
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  local_838._20_4_ = 0;
  local_7f0 = 0;
  local_7e0 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_818._M_string_length = 0;
  local_818.field_2._M_local_buf[0] = '\0';
  local_558 = (pointer)0x3ff0000000000000;
  p_Stack_550 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  local_618 = 0;
  uStack_610 = 0;
  local_628 = 0;
  uStack_620 = 0;
  local_638 = 0;
  uStack_630 = 0;
  local_648 = 0;
  uStack_640 = 0;
  local_658 = 0;
  uStack_650 = 0;
  do {
    cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                             (char)(istream *)local_238);
    piVar31 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_818,cVar28);
    _Var27._M_p = local_818._M_dataplus._M_p;
    if (((byte)piVar31[*(long *)(*(long *)piVar31 + -0x18) + 0x20] & 5) != 0) {
      printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n",local_658,local_648,local_638,local_628,
             local_618,local_608);
      pCVar32 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar32->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n\n");
      if (0 < (int)local_7f0) {
        uVar43 = local_7f0 & 0xffffffff;
        lVar45 = 0x10;
        lVar42 = 0;
        iVar30 = (int)local_838._24_8_;
        uVar46 = local_838._24_8_ & 0xffffffff;
        do {
          iVar12 = *(int *)((long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar42);
          dVar63 = 1.0 / (double)iVar12;
          pdVar20 = (double *)
                    ((long)(local_6f8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar45 + -0x10);
          local_3b8[0]._M_dataplus._M_p = (pointer)(dVar63 * *pdVar20);
          local_3b8[0]._M_string_length = (size_type)(dVar63 * pdVar20[1]);
          local_3b8[0].field_2._0_8_ =
               dVar63 * *(double *)
                         ((long)(local_6f8.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar45);
          dVar63 = *(double *)
                    ((long)(local_6f8.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar45 + -8);
          auVar55._8_8_ = 0;
          auVar55._0_8_ =
               *(ulong *)((long)(local_6f8.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar45 + -0x10
                         );
          auVar71._8_8_ = 0;
          auVar71._0_8_ = dVar63 * dVar63;
          auVar55 = vfmadd231sd_fma(auVar71,auVar55,auVar55);
          auVar56._8_8_ = 0;
          auVar56._0_8_ =
               *(ulong *)((long)(local_6f8.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar45);
          auVar55 = vfmadd213sd_fma(auVar56,auVar56,auVar55);
          auVar55 = vsqrtsd_avx(auVar55,auVar55);
          *(double *)
           ((long)(local_6e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar42 * 2 + (long)iVar30 * 8) =
               auVar55._0_8_ * 0.25;
          iVar40 = (int)uVar46;
          if (iVar12 < 3) {
            local_538[0]._M_dataplus._M_p._0_4_ = iVar40;
            __position._M_current =
                 (local_5e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_5e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_5e0,__position,(int *)local_538);
            }
            else {
              *__position._M_current = iVar40;
              (local_5e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          auVar67._8_8_ = 0;
          auVar67._0_8_ = local_3b8[0]._M_dataplus._M_p;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = local_3b8[0].field_2._M_allocated_capacity;
          auVar62._8_8_ = 0;
          auVar62._0_8_ =
               (double)local_3b8[0]._M_string_length * (double)local_3b8[0]._M_string_length;
          auVar55 = vfmadd231sd_fma(auVar62,auVar67,auVar67);
          auVar55 = vfmadd231sd_fma(auVar55,auVar75,auVar75);
          auVar55 = vsqrtsd_avx(auVar55,auVar55);
          bVar50 = 2.2250738585072014e-308 <= auVar55._0_8_;
          dVar63 = 1.0 / auVar55._0_8_;
          local_3b8[0]._M_dataplus._M_p =
               (pointer)((ulong)bVar50 * (long)((double)local_3b8[0]._M_dataplus._M_p * dVar63) +
                        (ulong)!bVar50 * 0x3ff0000000000000);
          local_3b8[0]._M_string_length =
               (ulong)bVar50 * (long)((double)local_3b8[0]._M_string_length * dVar63);
          local_3b8[0].field_2._0_8_ =
               (ulong)bVar50 * (long)((double)local_3b8[0].field_2._0_8_ * dVar63);
          lVar41 = *(long *)((long)&((local_6a8.
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar42 * 4);
          local_538[0]._M_dataplus._M_p = *(pointer *)(lVar41 + 0x20);
          local_538[0]._M_string_length = *(undefined8 *)(lVar41 + 0x28);
          local_538[0].field_2._0_8_ = *(size_type *)(lVar41 + 0x30);
          local_848 = (ChNodeFEAxyzD *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                    (&_Stack_840,&local_848,(allocator<chrono::fea::ChNodeFEAxyzD> *)&local_770,
                     (ChVector<double> *)local_538,(ChVector<double> *)local_3b8);
          (*(local_848->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[10])(0);
          pCVar18 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_848;
          local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_840._M_pi;
          if (_Stack_840._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_840._M_pi)->_M_use_count = (_Stack_840._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_840._M_pi)->_M_use_count = (_Stack_840._M_pi)->_M_use_count + 1;
            }
          }
          ChMesh::AddNode(pCVar18,&local_5f8);
          if (local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5f8.
                       super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (printNodes) {
            pCVar32 = GetLog();
            pCVar33 = ChStreamOutAscii::operator<<
                                (&pCVar32->super_ChStreamOutAscii,
                                 *(double *)
                                  &(local_848->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20);
            pCVar33 = ChStreamOutAscii::operator<<(pCVar33,"  ");
            pCVar33 = ChStreamOutAscii::operator<<
                                (pCVar33,*(double *)&(local_848->super_ChNodeFEAxyz).field_0x28);
            pCVar33 = ChStreamOutAscii::operator<<(pCVar33,"  ");
            pCVar33 = ChStreamOutAscii::operator<<
                                (pCVar33,*(double *)&(local_848->super_ChNodeFEAxyz).field_0x30);
            ChStreamOutAscii::operator<<(pCVar33,"\n");
          }
          if (_Stack_840._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_840._M_pi);
          }
          uVar46 = (ulong)(iVar40 + 1);
          lVar42 = lVar42 + 4;
          lVar45 = lVar45 + 0x18;
        } while (uVar43 << 2 != lVar42);
      }
      pCVar32 = GetLog();
      pcVar38 = "-----------------------------------------------------------\n";
      ChStreamOutAscii::operator<<
                (&pCVar32->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n");
      if (0 < (int)local_838._20_4_) {
        dVar63 = 0.0;
        local_838._24_8_ = ZEXT48((int)local_838._24_8_ - 1);
        local_780 = (double)(ulong)(uint)local_838._20_4_;
        do {
          this = (ChElementShellANCF_3423 *)
                 ChElementShellANCF_3423::operator_new
                           ((ChElementShellANCF_3423 *)0x3200,(size_t)pcVar38);
          ChElementShellANCF_3423::ChElementShellANCF_3423(this);
          local_3b8[0]._M_dataplus._M_p = (pointer)this;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChElementShellANCF_3423*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3b8[0]._M_string_length,
                     this);
          _Var27._M_p = local_3b8[0]._M_dataplus._M_p;
          peVar19 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar19->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (local_538,peVar19,
                     (ulong)(uint)(*local_7b8.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + local_838._24_4_));
          if ((local_538[0]._M_dataplus._M_p == (pointer)0x0) ||
             (local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       __dynamic_cast(local_538[0]._M_dataplus._M_p,&ChNodeBase::typeinfo,
                                      &ChNodeFEAxyzD::typeinfo,0xffffffffffffffff),
             local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_538[0]._M_string_length + 8) =
                     *(_Atomic_word *)(local_538[0]._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_538[0]._M_string_length + 8) =
                     *(_Atomic_word *)(local_538[0]._M_string_length + 8) + 1;
              }
            }
          }
          peVar19 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar19->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_848,peVar19,
                     (ulong)(uint)(local_7b8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[1] + local_838._24_4_));
          if ((local_848 == (ChNodeFEAxyzD *)0x0) ||
             (local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       __dynamic_cast(local_848,&ChNodeBase::typeinfo,&ChNodeFEAxyzD::typeinfo,
                                      0xffffffffffffffff),
             local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Stack_840._M_pi;
            if (_Stack_840._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Stack_840._M_pi)->_M_use_count = (_Stack_840._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Stack_840._M_pi)->_M_use_count = (_Stack_840._M_pi)->_M_use_count + 1;
              }
            }
          }
          peVar19 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar19->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_770,peVar19,
                     (ulong)(uint)(local_7b8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[2] + local_838._24_4_));
          if ((local_770.m_data[0] == 0.0) ||
             (local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       __dynamic_cast(local_770.m_data[0],&ChNodeBase::typeinfo,
                                      &ChNodeFEAxyzD::typeinfo,0xffffffffffffffff),
             local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_770.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_770.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_770.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_770.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_770.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_770.m_data[1] + 8) + 1;
              }
            }
          }
          peVar19 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          (*(peVar19->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                    (&local_7c8,peVar19,
                     (ulong)(uint)(local_7b8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[3] + local_838._24_4_));
          if ((local_7c8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == (element_type *)0x0) ||
             (local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       __dynamic_cast(local_7c8.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,&ChNodeBase::typeinfo,&ChNodeFEAxyzD::typeinfo,
                                      0xffffffffffffffff),
             local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
            local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 local_7c8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (local_7c8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_7c8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_7c8.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_7c8.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_7c8.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
          }
          ChElementShellANCF_3423::SetNodes
                    ((ChElementShellANCF_3423 *)_Var27._M_p,&local_728,&local_738,&local_748,
                     &local_758);
          if (local_758.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_758.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_7c8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_7c8.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_748.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_748.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_770.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_770.m_data[1]);
          }
          if (local_738.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_738.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (_Stack_840._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_840._M_pi);
          }
          if (local_728.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_728.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538[0]._M_string_length
                      );
          }
          pdVar20 = local_6d8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar1 = pdVar20[1];
          *(double *)(local_3b8[0]._M_dataplus._M_p + 0x90) = *pdVar20;
          *(double *)(local_3b8[0]._M_dataplus._M_p + 0x98) = dVar1;
          pCVar18 = (local_7e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
          local_6b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_3b8[0]._M_dataplus._M_p;
          local_6b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) =
                   *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) =
                   *(_Atomic_word *)(local_3b8[0]._M_string_length + 8) + 1;
            }
          }
          pcVar38 = (char *)&local_6b8;
          ChMesh::AddElement(pCVar18,(shared_ptr<chrono::fea::ChElementBase> *)pcVar38);
          if (local_6b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_6b8.
                       super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (printElements) {
            poVar34 = (ostream *)std::ostream::operator<<(&std::cout,SUB84(dVar63,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar34," ",1);
            lVar42 = 0;
            do {
              poVar34 = (ostream *)
                        std::ostream::operator<<
                                  (&std::cout,
                                   local_7b8.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar42]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar34," ",1);
              lVar42 = lVar42 + 1;
            } while (lVar42 != 4);
            cVar28 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
            pcVar38 = (char *)(ulong)(uint)(int)cVar28;
            std::ostream::put(-0x20);
            std::ostream::flush();
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[0]._M_string_length
                      );
          }
          dVar63 = (double)((long)dVar63 + 1);
        } while (dVar63 != local_780);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p != &local_818.field_2) {
        operator_delete(local_818._M_dataplus._M_p,
                        CONCAT71(local_818.field_2._M_allocated_capacity._1_7_,
                                 local_818.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(local_238);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_6d8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7b8);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::~vector(&local_6a8);
      if (local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_6f8.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6f8.
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_6f8.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6f8.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_688.m_data != (int *)0x0) {
        free(*(void **)(local_688.m_data + -2));
      }
      if (local_798.m_data != (double *)0x0) {
        free((void *)local_798.m_data[-1]);
      }
      return;
    }
    paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_818._M_dataplus._M_p + local_818._M_string_length);
    _Var48._M_p = local_818._M_dataplus._M_p;
    if (0 < (long)local_818._M_string_length >> 2) {
      lVar42 = ((long)local_818._M_string_length >> 2) + 1;
      paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_818._M_dataplus._M_p + 3);
      local_7d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_818._M_dataplus._M_p + local_818._M_string_length);
      _Var48._M_p = local_818._M_dataplus._M_p + (local_818._M_string_length & 0xfffffffffffffffc);
      do {
        iVar30 = isspace((uint)(byte)paVar44->_M_local_buf[-3]);
        if (iVar30 == 0) {
          paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar44->_M_local_buf + -3);
LAB_0060c296:
          paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7d8._0_8_;
          goto LAB_0060c2c7;
        }
        iVar30 = isspace((uint)(byte)paVar44->_M_local_buf[-2]);
        if (iVar30 == 0) {
          paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar44->_M_local_buf + -2);
          goto LAB_0060c296;
        }
        iVar30 = isspace((uint)(byte)paVar44->_M_local_buf[-1]);
        if (iVar30 == 0) {
          paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar44->_M_local_buf + -1);
          goto LAB_0060c296;
        }
        iVar30 = isspace((uint)(byte)paVar44->_M_local_buf[0]);
        if (iVar30 == 0) goto LAB_0060c296;
        lVar42 = lVar42 + -1;
        paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar44->_M_local_buf + 4);
      } while (1 < lVar42);
      paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d8._0_8_;
    }
    lVar42 = (long)paVar37 - (long)_Var48._M_p;
    if (lVar42 == 1) {
LAB_0060c2b5:
      iVar30 = isspace((uint)(byte)*_Var48._M_p);
      paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var48._M_p;
      if (iVar30 != 0) {
        paVar44 = paVar37;
      }
LAB_0060c2c7:
      if (paVar37 == paVar44) goto LAB_0060c2e8;
      std::__cxx11::string::_M_erase((ulong)&local_818,0);
    }
    else {
      if (lVar42 == 2) {
LAB_0060c2a0:
        iVar30 = isspace((uint)(byte)*_Var48._M_p);
        paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var48._M_p;
        if (iVar30 != 0) {
          _Var48._M_p = _Var48._M_p + 1;
          goto LAB_0060c2b5;
        }
        goto LAB_0060c2c7;
      }
      if (lVar42 == 3) {
        iVar30 = isspace((uint)(byte)*_Var48._M_p);
        paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var48._M_p;
        if (iVar30 != 0) {
          _Var48._M_p = _Var48._M_p + 1;
          goto LAB_0060c2a0;
        }
        goto LAB_0060c2c7;
      }
LAB_0060c2e8:
      local_818._M_string_length = 0;
      *_Var27._M_p = 0;
    }
    if (*local_818._M_dataplus._M_p != 0) {
      lVar42 = std::__cxx11::string::find((char *)&local_818,0x96e243,0);
      if (lVar42 == 0) {
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        uVar29 = atoi(local_818._M_dataplus._M_p);
        local_7f0 = CONCAT44(extraout_var_00,uVar29);
        printf("Found  %d nodes\n",(ulong)uVar29);
        pCVar32 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar32->super_ChStreamOutAscii,"Parsing information from \"Vertices\" \n");
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        sVar49 = (size_type)(int)local_7f0;
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                  (&local_6f8,sVar49);
        std::vector<double,_std::allocator<double>_>::resize
                  (local_6e0,(long)((int)local_838._24_8_ + (int)local_7f0));
        std::vector<int,_std::allocator<int>_>::resize(&local_718,sVar49);
        if (0 < (int)local_7f0) {
          iVar30 = 0;
          local_774 = (int)local_7f0 + (int)local_7e0;
          do {
            local_848 = (ChNodeFEAxyzD *)local_838;
            _Stack_840._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_838[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_818,_S_in);
            lVar42 = 0;
            for (lVar45 = -4;
                (piVar31 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_3b8,(string *)&local_848,' '),
                ((byte)piVar31[*(long *)(*(long *)piVar31 + -0x18) + 0x20] & 5) == 0 &&
                (uVar46 = lVar45 + 4, uVar46 < 0x14)); lVar45 = lVar45 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_538,(string *)&local_848,_S_in);
              if (((local_798.m_rows < 1) || (local_798.m_cols <= (long)uVar46)) ||
                 ((std::istream::_M_extract<double>((double *)local_538), local_798.m_rows < 1 ||
                  (local_798.m_cols <= (long)uVar46)))) goto LAB_0060d806;
              *(double *)((long)local_798.m_data + lVar42) =
                   local_780 * *(double *)((long)local_798.m_data + lVar42);
              std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
              std::ios_base::~ios_base(local_4c0);
              lVar42 = lVar42 + 8;
            }
            if ((local_798.m_rows < 1) ||
               (((local_798.m_cols < 1 || ((double)local_798.m_cols == 4.94065645841247e-324)) ||
                ((ulong)local_798.m_cols < 3)))) {
LAB_0060d806:
              pcVar38 = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
              ;
LAB_0060d832:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,pcVar38);
            }
            local_548._8_8_ = 0;
            local_548._0_8_ = *local_798.m_data;
            local_668 = local_798.m_data[1];
            local_7d8._8_8_ = 0;
            local_7d8._0_8_ = local_798.m_data[2];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0];
            auVar51._8_8_ = 0;
            auVar51._0_8_ =
                 local_668 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar55 = vfmadd231sd_fma(auVar51,local_548,auVar5);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[3];
            auVar52._8_8_ = 0;
            auVar52._0_8_ =
                 local_668 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
            auVar56 = vfmadd231sd_fma(auVar52,local_548,auVar6);
            uStack_660 = 0;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[6];
            auVar54._8_8_ = 0;
            auVar54._0_8_ =
                 local_668 *
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar71 = vfmadd231sd_fma(auVar54,local_548,auVar7);
            auVar59._8_8_ = 0;
            auVar59._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar55 = vfmadd231sd_fma(auVar55,local_7d8,auVar59);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[5];
            auVar56 = vfmadd231sd_fma(auVar56,local_7d8,auVar8);
            auVar53._8_8_ = 0;
            auVar53._0_8_ =
                 (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar71 = vfmadd231sd_fma(auVar71,local_7d8,auVar53);
            local_770.m_data[0] = auVar55._0_8_ + local_5e8->m_data[0];
            local_770.m_data[1] = auVar56._0_8_ + local_5e8->m_data[1];
            local_770.m_data[2] = auVar71._0_8_ + local_5e8->m_data[2];
            local_7c8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_538[0]._M_dataplus._M_p = local_558;
            local_538[0]._M_string_length = (size_type)p_Stack_550;
            local_538[0].field_2._M_allocated_capacity = 0x3ff0000000000000;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>>
                      (&local_7c8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(ChNodeFEAxyzD **)&local_7c8,
                       (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_7f1,&local_770,
                       (ChVector<double> *)local_538);
            std::
            vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
            ::push_back(&local_6a8,&local_7c8);
            bVar50 = (int)local_7e0 == 0;
            if (lVar42 != 0x20) {
              pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_538,
                             "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                             &local_818);
              plVar36 = (long *)std::__cxx11::string::append((char *)local_538);
              psVar39 = (size_type *)(plVar36 + 2);
              local_598._M_dataplus._M_p = (pointer)*plVar36;
              if ((size_type *)local_598._M_dataplus._M_p == psVar39) {
                local_598.field_2._M_allocated_capacity = *psVar39;
                local_598.field_2._8_8_ = plVar36[3];
                local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              }
              else {
                local_598.field_2._M_allocated_capacity = *psVar39;
              }
              local_598._M_string_length = plVar36[1];
              *plVar36 = (long)psVar39;
              plVar36[1] = 0;
              *(undefined1 *)(plVar36 + 2) = 0;
              ChException::ChException(pCVar35,&local_598);
              __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
            }
            cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_818,cVar28);
            if (local_7c8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_7c8.
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
            if (local_848 != (ChNodeFEAxyzD *)local_838) {
              operator_delete(local_848,CONCAT71(local_838._1_7_,local_838[0]) + 1);
            }
            auVar58._8_8_ = uStack_650;
            auVar58._0_8_ = local_658;
            iVar30 = iVar30 + 1;
            local_7e0 = (ulong)((int)local_7e0 + 1);
            uVar21 = vcmpsd_avx512f(local_548,auVar58,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            lVar42 = local_548._0_8_;
            local_658 = (ulong)bVar22 * lVar42 +
                        (ulong)!bVar22 * ((ulong)bVar50 * lVar42 + (ulong)!bVar50 * local_658);
            auVar60._8_8_ = uStack_640;
            auVar60._0_8_ = local_648;
            uVar21 = vcmpsd_avx512f(auVar60,local_548,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            local_648 = (ulong)bVar22 * lVar42 +
                        (ulong)!bVar22 * ((ulong)bVar50 * lVar42 + (ulong)!bVar50 * local_648);
            auVar57._8_8_ = uStack_660;
            auVar57._0_8_ = local_668;
            auVar61._8_8_ = uStack_630;
            auVar61._0_8_ = local_638;
            uVar21 = vcmpsd_avx512f(auVar57,auVar61,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            local_638 = (ulong)bVar22 * (long)local_668 +
                        (ulong)!bVar22 *
                        ((ulong)bVar50 * (long)local_668 + (ulong)!bVar50 * local_638);
            auVar24._8_8_ = uStack_620;
            auVar24._0_8_ = local_628;
            uVar21 = vcmpsd_avx512f(auVar24,auVar57,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            local_628 = (ulong)bVar22 * (long)local_668 +
                        (ulong)!bVar22 *
                        ((ulong)bVar50 * (long)local_668 + (ulong)!bVar50 * local_628);
            auVar25._8_8_ = uStack_610;
            auVar25._0_8_ = local_618;
            uVar21 = vcmpsd_avx512f(local_7d8,auVar25,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            lVar42 = local_7d8._0_8_;
            local_618 = (ulong)bVar22 * lVar42 +
                        (ulong)!bVar22 * ((ulong)bVar50 * lVar42 + (ulong)!bVar50 * local_618);
            auVar26._8_8_ = uStack_600;
            auVar26._0_8_ = local_608;
            uVar21 = vcmpsd_avx512f(auVar26,local_7d8,1);
            bVar22 = (bool)((byte)uVar21 & 1);
            local_608 = (ulong)bVar22 * lVar42 +
                        (ulong)!bVar22 * ((ulong)bVar50 * lVar42 + (ulong)!bVar50 * local_608);
          } while (iVar30 != (int)local_7f0);
          local_7e0 = (ulong)local_774;
        }
      }
      lVar42 = std::__cxx11::string::find((char *)&local_818,0x9da8d4,0);
      if (lVar42 == 0) {
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        uVar29 = atoi(local_818._M_dataplus._M_p);
        printf("Found %d Edges.\n",(ulong)uVar29);
        pCVar32 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar32->super_ChStreamOutAscii,"Parsing edges from \"Edges\" \n");
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        if (0 < (int)uVar29) {
          uVar47 = 0;
          do {
            local_848 = (ChNodeFEAxyzD *)local_838;
            _Stack_840._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_838[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_818,_S_in);
            lVar42 = 0;
            for (uVar46 = 0;
                (piVar31 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_3b8,(string *)&local_848,' '),
                ((byte)piVar31[*(long *)(*(long *)piVar31 + -0x18) + 0x20] & 5) == 0 &&
                (uVar46 < 0x14)); uVar46 = uVar46 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_538,(string *)&local_848,_S_in);
              if ((local_688.m_rows < 1) || (local_688.m_cols <= (long)uVar46)) {
                pcVar38 = 
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<int, -1, -1, 1>, Level = 1]"
                ;
                goto LAB_0060d832;
              }
              std::istream::operator>>(local_538,(int *)((long)local_688.m_data + lVar42));
              std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
              std::ios_base::~ios_base(local_4c0);
              lVar42 = lVar42 + 4;
            }
            if (uVar46 != 3) {
              pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_538,"ERROR in .mesh file, Edges require 3 node IDs, see line:\n",
                             &local_818);
              plVar36 = (long *)std::__cxx11::string::append((char *)local_538);
              psVar39 = (size_type *)(plVar36 + 2);
              local_5b8._M_dataplus._M_p = (pointer)*plVar36;
              if ((size_type *)local_5b8._M_dataplus._M_p == psVar39) {
                local_5b8.field_2._M_allocated_capacity = *psVar39;
                local_5b8.field_2._8_8_ = plVar36[3];
                local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
              }
              else {
                local_5b8.field_2._M_allocated_capacity = *psVar39;
              }
              local_5b8._M_string_length = plVar36[1];
              *plVar36 = (long)psVar39;
              plVar36[1] = 0;
              *(undefined1 *)(plVar36 + 2) = 0;
              ChException::ChException(pCVar35,&local_5b8);
              __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
            }
            cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                     (char)(istream *)local_238);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_818,cVar28);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
            if (local_848 != (ChNodeFEAxyzD *)local_838) {
              operator_delete(local_848,CONCAT71(local_838._1_7_,local_838[0]) + 1);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar29);
        }
      }
      lVar42 = std::__cxx11::string::find((char *)&local_818,0x96e32e,0);
      if (lVar42 == 0) {
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        local_838._20_4_ = atoi(local_818._M_dataplus._M_p);
        printf("Found %d elements.\n",(ulong)(uint)local_838._20_4_);
        pCVar32 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar32->super_ChStreamOutAscii,"Parsing nodeset from \"Quadrilaterals\" \n");
        cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_818,cVar28);
        if (0 < (int)local_838._20_4_) {
          local_668 = (double)(ulong)(uint)local_838._20_4_;
          dVar63 = 0.0;
          do {
            local_848 = (ChNodeFEAxyzD *)local_838;
            _Stack_840._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_838[0] = 0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_818,_S_in);
            sVar49 = (long)dVar63 + 1;
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(&local_7b8,sVar49);
            std::vector<int,_std::allocator<int>_>::resize
                      (local_7b8.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)dVar63,5);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::resize(&local_6d8,sVar49);
            std::vector<double,_std::allocator<double>_>::resize
                      (local_6d8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)dVar63,2);
            local_7d8._0_8_ = sVar49;
            lVar42 = 0;
            for (uVar46 = 0;
                (piVar31 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_3b8,(string *)&local_848,' '),
                ((byte)piVar31[*(long *)(*(long *)piVar31 + -0x18) + 0x20] & 5) == 0 &&
                (uVar46 < 0x14)); uVar46 = uVar46 + 1) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_538,(string *)&local_848,_S_in);
              std::istream::operator>>
                        (local_538,
                         (int *)((long)local_7b8.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar42));
              std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
              std::ios_base::~ios_base(local_4c0);
              lVar42 = lVar42 + 4;
            }
            piVar13 = local_7b8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            lVar42 = (long)*piVar13 + -1;
            peVar14 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar42].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar1 = *(double *)&(peVar14->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = dVar1;
            peVar15 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar13[1] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar2 = *(double *)&(peVar15->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = dVar2;
            peVar16 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar13[2] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar3 = *(double *)&(peVar16->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar81._8_8_ = dVar3;
            auVar81._0_8_ = dVar3;
            peVar17 = local_6a8.
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)piVar13[3] + -1].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            dVar2 = dVar1 - dVar2;
            dVar4 = *(double *)&(peVar17->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = dVar4;
            auVar77._8_8_ = 0;
            auVar77._0_8_ =
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar42].m_data[2];
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)*piVar13 + -1] =
                 local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)*piVar13 + -1] + 1;
            lVar45 = (long)piVar13[1];
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar45 + -1] =
                 local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar45 + -1] + 1;
            uVar21 = *(undefined8 *)&(peVar14->super_ChNodeFEAxyz).field_0x30;
            auVar74._8_8_ = uVar21;
            auVar74._0_8_ = uVar21;
            uVar21 = *(undefined8 *)&(peVar15->super_ChNodeFEAxyz).field_0x30;
            auVar68._8_8_ = uVar21;
            auVar68._0_8_ = uVar21;
            auVar55 = *(undefined1 (*) [16])&(peVar17->super_ChNodeFEAxyz).field_0x28;
            auVar56 = *(undefined1 (*) [16])&(peVar14->super_ChNodeFEAxyz).field_0x28;
            auVar71 = *(undefined1 (*) [16])&(peVar15->super_ChNodeFEAxyz).field_0x28;
            auVar67 = *(undefined1 (*) [16])&(peVar16->super_ChNodeFEAxyz).field_0x28;
            lVar41 = (long)piVar13[2];
            auVar59 = vunpcklpd_avx(auVar74,auVar72);
            uVar21 = *(undefined8 *)&(peVar17->super_ChNodeFEAxyz).field_0x30;
            auVar73._8_8_ = uVar21;
            auVar73._0_8_ = uVar21;
            auVar8 = vunpcklpd_avx(auVar68,auVar79);
            auVar62 = vsubpd_avx(auVar56,auVar71);
            auVar75 = vsubpd_avx(auVar56,auVar55);
            auVar7 = vunpcklpd_avx(auVar80,auVar79);
            auVar51 = vsubpd_avx512vl(auVar71,auVar56);
            auVar52 = vsubpd_avx512vl(auVar55,auVar56);
            auVar5 = vsubpd_avx(auVar55,auVar67);
            auVar6 = vsubpd_avx(auVar67,auVar55);
            auVar7 = vsubpd_avx(auVar7,auVar81);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = dVar2;
            auVar53 = vshufpd_avx512vl(auVar62,auVar64,1);
            auVar54 = vshufpd_avx512vl(auVar52,auVar52,1);
            auVar55 = vshufpd_avx512vl(auVar5,auVar5,1);
            auVar56 = vmulsd_avx512f(auVar5,auVar54);
            auVar57 = vfmsub231sd_avx512f(auVar56,auVar52,auVar55);
            auVar76._8_8_ = 0;
            auVar76._0_8_ = dVar4 - dVar1;
            auVar58 = vmulsd_avx512f(auVar55,auVar76);
            auVar55 = vunpcklpd_avx(auVar73,auVar80);
            auVar55 = vsubpd_avx(auVar59,auVar55);
            auVar56 = vsubpd_avx(auVar8,auVar59);
            auVar54 = vfmsub231sd_avx512f(auVar58,auVar7,auVar54);
            auVar59 = vunpcklpd_avx512vl(auVar75,auVar55);
            auVar58 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar59 = vmulpd_avx512vl(auVar59,auVar53);
            auVar53 = vmulsd_avx512f(auVar58,auVar62);
            auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar59 = vfmsub231pd_avx512vl(auVar59,auVar62,auVar55);
            auVar59 = vaddpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                               local_6f8.
                                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                                               m_data);
            auVar53 = vfmsub231sd_avx512f(auVar53,auVar64,auVar75);
            auVar75 = vunpcklpd_avx(auVar62,auVar75);
            auVar65._8_8_ = auVar55._8_8_;
            auVar65._0_8_ = dVar2;
            auVar69._0_8_ = auVar75._0_8_ * auVar75._0_8_;
            auVar69._8_8_ = auVar75._8_8_ * auVar75._8_8_;
            auVar53 = vaddsd_avx512f(auVar53,auVar77);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)&(peVar16->super_ChNodeFEAxyz).field_0x30;
            auVar60 = vmovddup_avx512vl(auVar9);
            auVar75 = vfmadd213pd_fma(auVar65,auVar65,auVar69);
            auVar55 = vshufpd_avx(auVar62,auVar55,1);
            auVar75 = vfmadd213pd_fma(auVar55,auVar55,auVar75);
            *(undefined1 (*) [16])
             local_6f8.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar42].m_data = auVar59;
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar42].m_data[2] = auVar53._0_8_;
            auVar62 = vsubpd_avx(auVar71,auVar67);
            auVar61 = vunpcklpd_avx512vl(auVar51,auVar56);
            auVar67 = vsubpd_avx(auVar67,auVar71);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = dVar3 - dVar4;
            auVar55 = vshufpd_avx(auVar6,auVar78,1);
            auVar53 = vunpcklpd_avx512vl(auVar60,auVar81);
            auVar71 = vsqrtpd_avx(auVar75);
            auVar59 = vunpckhpd_avx(auVar62,auVar7);
            auVar75 = vsubpd_avx(auVar53,auVar8);
            auVar58 = vmulsd_avx512f(auVar58,auVar62);
            auVar53 = vunpcklpd_avx(auVar5,auVar62);
            auVar8 = vunpckhpd_avx(auVar5,auVar62);
            auVar60 = vmulpd_avx512vl(auVar61,auVar59);
            auVar70._0_8_ = auVar53._0_8_ * auVar53._0_8_;
            auVar70._8_8_ = auVar53._8_8_ * auVar53._8_8_;
            auVar59 = vunpcklpd_avx(auVar67,auVar75);
            auVar53 = vfmsub231pd_fma(auVar60,auVar62,auVar56);
            auVar56 = vshufpd_avx(auVar7,auVar7,1);
            dVar2 = local_6f8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[0];
            dVar3 = local_6f8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[1];
            auVar83._0_8_ = auVar59._0_8_ * auVar55._0_8_;
            auVar83._8_8_ = auVar59._8_8_ * auVar55._8_8_;
            auVar62 = vfmadd231pd_fma(auVar70,auVar7,auVar7);
            auVar51 = vfmsub213sd_avx512f(auVar56,auVar51,auVar58);
            dVar1 = local_6f8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[2];
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar41 + -1] =
                 local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar41 + -1] + 1;
            lVar42 = (long)piVar13[3];
            auVar59 = vfmsub231pd_fma(auVar83,auVar6,auVar75);
            auVar55 = vshufpd_avx(auVar75,auVar75,1);
            auVar56 = vfmadd213pd_fma(auVar8,auVar8,auVar62);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = auVar55._0_8_ * auVar6._0_8_;
            auVar67 = vfmsub231sd_fma(auVar82,auVar78,auVar67);
            auVar62 = vmulsd_avx512f(auVar7,auVar52);
            auVar55 = vsqrtpd_avx(auVar56);
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[0] = auVar53._0_8_ + dVar2
            ;
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[1] = auVar53._8_8_ + dVar3
            ;
            auVar56 = vfmsub231sd_fma(auVar62,auVar5,auVar76);
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar45 + -1].m_data[2] = auVar51._0_8_ + dVar1
            ;
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[0];
            auVar62 = vaddsd_avx512f(auVar57,auVar10);
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[0] = auVar62._0_8_;
            auVar11._8_8_ = 0;
            auVar11._0_8_ =
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[1];
            auVar62 = vaddsd_avx512f(auVar54,auVar11);
            auVar66._0_8_ = auVar71._0_8_ + auVar55._0_8_;
            auVar66._8_8_ = auVar71._8_8_ + auVar55._8_8_;
            auVar23._8_8_ = 0x3fe0000000000000;
            auVar23._0_8_ = 0x3fe0000000000000;
            auVar55 = vmulpd_avx512vl(auVar66,auVar23);
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[1] = auVar62._0_8_;
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[2] =
                 auVar56._0_8_ +
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar41 + -1].m_data[2];
            dVar1 = local_6f8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[1];
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[0] =
                 auVar59._0_8_ +
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[0];
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[1] = auVar59._8_8_ + dVar1
            ;
            local_6f8.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[2] =
                 auVar67._0_8_ +
                 local_6f8.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar42 + -1].m_data[2];
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar42 + -1] =
                 local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar42 + -1] + 1;
            *(undefined1 (*) [16])
             local_6d8.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)dVar63].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start = auVar55;
            if (uVar46 != 5) {
              pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(local_538,
                             "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                             &local_818);
              plVar36 = (long *)std::__cxx11::string::append((char *)local_538);
              psVar39 = (size_type *)(plVar36 + 2);
              local_5d8._M_dataplus._M_p = (pointer)*plVar36;
              if ((size_type *)local_5d8._M_dataplus._M_p == psVar39) {
                local_5d8.field_2._M_allocated_capacity = *psVar39;
                local_5d8.field_2._8_8_ = plVar36[3];
                local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
              }
              else {
                local_5d8.field_2._M_allocated_capacity = *psVar39;
              }
              local_5d8._M_string_length = plVar36[1];
              *plVar36 = (long)psVar39;
              plVar36[1] = 0;
              *(undefined1 *)(plVar36 + 2) = 0;
              ChException::ChException(pCVar35,&local_5d8);
              __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
            }
            cVar28 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                     (char)(istream *)local_238);
            dVar63 = (double)local_7d8._0_8_;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_818,cVar28);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
            if (local_848 != (ChNodeFEAxyzD *)local_838) {
              operator_delete(local_848,CONCAT71(local_838._1_7_,local_838[0]) + 1);
            }
          } while (dVar63 != local_668);
        }
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<ChMesh> mesh,
                                            const char* filename,
                                            std::shared_ptr<ChMaterialShellANCF> my_material,
                                            std::vector<double>& node_ave_area,
                                            std::vector<int>& Boundary_nodes,
                                            ChVector<> pos_transform,
                                            ChMatrix33<> rot_transform,
                                            double scaleFactor,
                                            bool printNodes,
                                            bool printElements) {
    int added_nodes = 0;
    int added_elements = 0;
    double dx, dy;
    int nodes_offset = mesh->GetNnodes();
    printf("Current number of nodes in mesh is %d \n", nodes_offset);
    ChMatrixDynamic<double> nodesXYZ(1, 4);
    ChMatrixDynamic<int> NumBEdges(1, 3);  // To store boundary nodes
    ChMatrixNM<double, 1, 6> BoundingBox;  // (xmin xmax ymin ymax zmin zmax) bounding box of the mesh
    std::vector<ChVector<>> Normals;       // To store the normal vectors
    std::vector<int> num_Normals;
    ChVector<double> pos1, pos2, pos3, pos4;                  // Position of nodes in each element
    ChVector<double> vec1, vec2, vec3;                        // intermediate vectors for calculation of normals
    std::vector<std::shared_ptr<ChNodeFEAxyzD>> nodesVector;  // To store intermediate nodes
    std::vector<std::vector<int>> elementsVector;             // nodes of each element
    std::vector<std::vector<double>> elementsdxdy;            // dx, dy of elements

    int TotalNumNodes = 0, TotalNumElements = 0, TotalNumBEdges = 0;
    BoundingBox.setZero();

    std::ifstream fin(filename);
    if (!fin.good())
        throw ChException("ERROR opening Mesh file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        if (line[0] == 0)
            continue;  // skip empty linesnodes_offset
        if (line.find("Vertices") == 0) {
            std::getline(fin, line);
            TotalNumNodes = atoi(line.c_str());
            printf("Found  %d nodes\n", TotalNumNodes);
            GetLog() << "Parsing information from \"Vertices\" \n";
            std::getline(fin, line);
            Normals.resize(TotalNumNodes);
            node_ave_area.resize(nodes_offset + TotalNumNodes);
            num_Normals.resize(TotalNumNodes);
            for (int inode = 0; inode < TotalNumNodes; inode++) {
                double loc_x, loc_y, loc_z;
                double dir_x, dir_y, dir_z;

                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> nodesXYZ(0, ntoken);
                    nodesXYZ(0, ntoken) *= scaleFactor;
                    ++ntoken;
                }

                loc_x = nodesXYZ(0, 0);
                loc_y = nodesXYZ(0, 1);
                loc_z = nodesXYZ(0, 2);
                dir_x = 1.0;
                dir_y = 1.0;
                dir_z = 1.0;

                ChVector<> node_position(loc_x, loc_y, loc_z);
                node_position = rot_transform * node_position;  // rotate/scale, if needed
                node_position = pos_transform + node_position;  // move, if needed
                auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, ChVector<>(dir_x, dir_y, dir_z));
                nodesVector.push_back(node);

                if (loc_x < BoundingBox(0, 0) || added_nodes == 0)
                    BoundingBox(0, 0) = loc_x;
                if (loc_x > BoundingBox(0, 1) || added_nodes == 0)
                    BoundingBox(0, 1) = loc_x;
                if (loc_y < BoundingBox(0, 2) || added_nodes == 0)
                    BoundingBox(0, 2) = loc_y;
                if (loc_y > BoundingBox(0, 3) || added_nodes == 0)
                    BoundingBox(0, 3) = loc_y;

                if (loc_z < BoundingBox(0, 4) || added_nodes == 0)
                    BoundingBox(0, 4) = loc_z;
                if (loc_z > BoundingBox(0, 5) || added_nodes == 0)
                    BoundingBox(0, 5) = loc_z;
                ++added_nodes;

                if (ntoken != 4)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");

                std::getline(fin, line);
            }
        }

        // Reading the Boundary nodes ...
        if (line.find("Edges") == 0) {
            std::getline(fin, line);
            TotalNumBEdges = atoi(line.c_str());
            printf("Found %d Edges.\n", TotalNumBEdges);
            GetLog() << "Parsing edges from \"Edges\" \n";
            std::getline(fin, line);

            for (int edge = 0; edge < TotalNumBEdges; edge++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> NumBEdges(0, ntoken);
                    ++ntoken;
                }

                if (ntoken != 3)
                    throw ChException("ERROR in .mesh file, Edges require 3 node IDs, see line:\n" + line + "\n");

                std::getline(fin, line);
            }
        }

        //
        if (line.find("Quadrilaterals") == 0) {
            std::getline(fin, line);
            TotalNumElements = atoi(line.c_str());
            printf("Found %d elements.\n", TotalNumElements);
            GetLog() << "Parsing nodeset from \"Quadrilaterals\" \n";
            std::getline(fin, line);

            for (int ele = 0; ele < TotalNumElements; ele++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                elementsVector.resize(ele + 1);
                elementsVector[ele].resize(5);
                elementsdxdy.resize(ele + 1);
                elementsdxdy[ele].resize(2);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> elementsVector[ele][ntoken];
                    ++ntoken;
                }

                // Calculating the true surface normals based on the nodal information
                pos1 = nodesVector[elementsVector[ele][0] - 1]->GetPos();
                pos2 = nodesVector[elementsVector[ele][1] - 1]->GetPos();
                pos4 = nodesVector[elementsVector[ele][2] - 1]->GetPos();
                pos3 = nodesVector[elementsVector[ele][3] - 1]->GetPos();

                // For the first node
                vec1 = (pos1 - pos2);
                vec2 = (pos1 - pos3);
                Normals[elementsVector[ele][0] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][0] - 1]++;
                // For the second node
                vec1 = (pos2 - pos4);
                vec2 = (pos2 - pos1);
                Normals[elementsVector[ele][1] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][1] - 1]++;
                // For the third node
                vec1 = (pos3 - pos1);
                vec2 = (pos3 - pos4);
                Normals[elementsVector[ele][2] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][2] - 1]++;
                // For the forth node
                vec1 = (pos4 - pos3);
                vec2 = (pos4 - pos2);
                Normals[elementsVector[ele][3] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][3] - 1]++;

                vec1 = pos1 - pos2;
                vec2 = pos3 - pos4;
                dx = (vec1.Length() + vec2.Length()) / 2;
                vec1 = pos1 - pos3;
                vec2 = pos2 - pos4;
                dy = (vec1.Length() + vec2.Length()) / 2;

                // Set element dimensions
                elementsdxdy[ele][0] = dx;
                elementsdxdy[ele][1] = dy;
                ++added_elements;
                if (ntoken != 5)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");
                std::getline(fin, line);
            }
        }
    }

    printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n", BoundingBox(0, 0), BoundingBox(0, 1), BoundingBox(0, 2),
           BoundingBox(0, 3), BoundingBox(0, 4), BoundingBox(0, 5));

    GetLog() << "-----------------------------------------------------------\n\n";
    //
    for (int inode = 0; inode < TotalNumNodes; inode++) {
        ChVector<> node_normal = (Normals[inode] / num_Normals[inode]);
        // Very useful information to store: 1/4 of area of neighbouring elements contribute to each node's average area
        node_ave_area[nodes_offset + inode] = Normals[inode].Length() / 4;

        if (num_Normals[inode] <= 2)
            Boundary_nodes.push_back(nodes_offset + inode);
        node_normal.Normalize();

        ChVector<> node_position = nodesVector[inode]->GetPos();
        auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, node_normal);
        node->SetMass(0);
        // Add node to mesh
        mesh->AddNode(node);
        if (printNodes) {
            GetLog() << node->GetPos().x() << "  " << node->GetPos().y() << "  " << node->GetPos().z() << "\n";
        }
    }
    GetLog() << "-----------------------------------------------------------\n";
    for (int ielem = 0; ielem < 0 + TotalNumElements; ielem++) {
        auto element = chrono_types::make_shared<ChElementShellANCF_3423>();
        element->SetNodes(
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][0] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][1] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][2] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][3] - 1)));
        dx = elementsdxdy[ielem][0];
        dy = elementsdxdy[ielem][1];
        element->SetDimensions(dx, dy);
        // Add element to mesh
        mesh->AddElement(element);
        if (printElements) {
            std::cout << ielem << " ";
            for (int i = 0; i < 4; i++)
                std::cout << elementsVector[ielem][i] << " ";
            std::cout << std::endl;
        }
    }
}